

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

bool __thiscall
Js::InlineCache::ConfirmCacheMiss(InlineCache *this,Type *oldType,PropertyValueInfo *info)

{
  ushort uVar1;
  InlineCacheFlags IVar2;
  bool local_31;
  bool local_21;
  PropertyValueInfo *info_local;
  Type *oldType_local;
  InlineCache *this_local;
  
  local_21 = false;
  if (((this->u).local.type != oldType) &&
     (local_21 = false, (this->u).local.typeWithoutProperty != oldType)) {
    local_31 = true;
    if (((Type *)(this->u).proto.prototypeObject == oldType) &&
       (local_31 = true, info != (PropertyValueInfo *)0x0)) {
      uVar1 = (this->u).accessor.field_1.rawUInt16;
      IVar2 = PropertyValueInfo::GetFlags(info);
      local_31 = (uint)(uVar1 >> 1 & 3) != (int)(char)IVar2;
    }
    local_21 = local_31;
  }
  return local_21;
}

Assistant:

bool InlineCache::ConfirmCacheMiss(const Type * oldType, const PropertyValueInfo* info) const
    {
        return u.local.type != oldType
            && u.proto.type != oldType
            && (u.accessor.type != oldType || info == NULL || u.accessor.flags != info->GetFlags());
    }